

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3DatabasePageSize(int *pRc,Fts3Table *p)

{
  int iVar1;
  int iVar2;
  char *zSql;
  Mem *pMem;
  i64 iVar3;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_30;
  
  if (*pRc != 0) {
    return;
  }
  zSql = sqlite3_mprintf("PRAGMA %Q.page_size",p->zDb);
  if (zSql == (char *)0x0) {
    iVar2 = 7;
  }
  else {
    iVar2 = 0;
    iVar1 = sqlite3LockAndPrepare(p->db,zSql,-1,0,(Vdbe *)0x0,&local_30,(char **)0x0);
    if (iVar1 == 0x17) {
      p->nPgsz = 0x400;
    }
    else {
      iVar2 = iVar1;
      if (iVar1 == 0) {
        sqlite3_step(local_30);
        pMem = columnMem(local_30,0);
        iVar3 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(local_30);
        p->nPgsz = (int)iVar3;
        iVar2 = sqlite3_finalize(local_30);
      }
    }
  }
  sqlite3_free(zSql);
  *pRc = iVar2;
  return;
}

Assistant:

static void fts3DatabasePageSize(int *pRc, Fts3Table *p){
  if( *pRc==SQLITE_OK ){
    int rc;                       /* Return code */
    char *zSql;                   /* SQL text "PRAGMA %Q.page_size" */
    sqlite3_stmt *pStmt;          /* Compiled "PRAGMA %Q.page_size" statement */
  
    zSql = sqlite3_mprintf("PRAGMA %Q.page_size", p->zDb);
    if( !zSql ){
      rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3_prepare(p->db, zSql, -1, &pStmt, 0);
      if( rc==SQLITE_OK ){
        sqlite3_step(pStmt);
        p->nPgsz = sqlite3_column_int(pStmt, 0);
        rc = sqlite3_finalize(pStmt);
      }else if( rc==SQLITE_AUTH ){
        p->nPgsz = 1024;
        rc = SQLITE_OK;
      }
    }
    assert( p->nPgsz>0 || rc!=SQLITE_OK );
    sqlite3_free(zSql);
    *pRc = rc;
  }
}